

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O0

int lws_cache_lookup(lws_cache_ttl_lru *cache,char *wildcard_key,void **pdata,size_t *psize)

{
  int iVar1;
  uint8_t *ptr;
  lws_cache_match_t *m_1;
  lws_dll2 *d_1;
  lws_cache_match_t *m;
  lws_dll2 *d;
  ulong uStack_f0;
  int n;
  size_t sum;
  uint8_t *temp;
  uint8_t *p;
  char meta_key [128];
  lws_usec_t expiry;
  lws_dll2_owner_t results_owner;
  lws_cache_ttl_lru *l1;
  size_t *psize_local;
  void **pdata_local;
  char *wildcard_key_local;
  lws_cache_ttl_lru *cache_local;
  
  meta_key[0x78] = '\0';
  meta_key[0x79] = '\0';
  meta_key[0x7a] = '\0';
  meta_key[0x7b] = '\0';
  meta_key[0x7c] = '\0';
  meta_key[0x7d] = '\0';
  meta_key[0x7e] = '\0';
  meta_key[0x7f] = '\0';
  uStack_f0 = 0;
  results_owner._16_8_ = cache;
  memset(&expiry,0,0x18);
  p._0_1_ = 0x21;
  lws_strncpy((char *)((long)&p + 1),wildcard_key,0x7e);
  iVar1 = (**(code **)(*(long *)(results_owner._16_8_ + 0x20) + 0x38))
                    (results_owner._16_8_,&p,pdata,psize);
  wildcard_key_local = (char *)cache;
  if (iVar1 == 0) {
    cache_local._4_4_ = 0;
  }
  else {
    for (; *(long *)(wildcard_key_local + 0x18) != 0;
        wildcard_key_local = *(char **)(wildcard_key_local + 0x18)) {
    }
    iVar1 = (**(code **)(*(long *)(wildcard_key_local + 0x20) + 0x28))
                      (wildcard_key_local,wildcard_key,&expiry);
    if (iVar1 == 0) {
      for (m = (lws_cache_match_t *)results_owner.tail; m != (lws_cache_match_t *)0x0;
          m = (lws_cache_match_t *)(m->list).next) {
        uStack_f0 = m->tag_size + uStack_f0 + 9;
        if ((m->expiry != 0) && ((meta_key._120_8_ == 0 || ((long)meta_key._120_8_ < m->expiry)))) {
          meta_key._120_8_ = m->expiry;
        }
      }
      _lws_log(0x10,"%s: results %d, size %d\n","lws_cache_lookup",(ulong)(uint)results_owner.head,
               uStack_f0 & 0xffffffff);
      ptr = (uint8_t *)lws_realloc((void *)0x0,uStack_f0,"lws_cache_lookup");
      if (ptr == (uint8_t *)0x0) {
        lws_cache_clear_matches((lws_dll2_owner_t *)&expiry);
        cache_local._4_4_ = 1;
      }
      else {
        temp = ptr;
        for (m_1 = (lws_cache_match_t *)results_owner.tail; m_1 != (lws_cache_match_t *)0x0;
            m_1 = (lws_cache_match_t *)(m_1->list).next) {
          lws_ser_wu32be(temp,(uint32_t)m_1->payload_size);
          temp = temp + 4;
          lws_ser_wu32be(temp,(uint32_t)m_1->tag_size);
          temp = temp + 4;
          memcpy(temp,m_1 + 1,m_1->tag_size + 1);
          temp = temp + m_1->tag_size + 1;
        }
        lws_cache_clear_matches((lws_dll2_owner_t *)&expiry);
        iVar1 = (**(code **)(*(long *)(results_owner._16_8_ + 0x20) + 0x18))
                          (results_owner._16_8_,&p,ptr,uStack_f0,meta_key._120_8_,&temp);
        lws_realloc(ptr,0,"lws_free");
        if (iVar1 == 0) {
          *pdata = temp;
          *psize = uStack_f0;
          cache_local._4_4_ = 0;
        }
        else {
          cache_local._4_4_ = 1;
        }
      }
    }
    else {
      _lws_log(0x10,"%s: bs lookup fail\n","lws_cache_lookup");
      lws_cache_clear_matches((lws_dll2_owner_t *)&expiry);
      cache_local._4_4_ = 1;
    }
  }
  return cache_local._4_4_;
}

Assistant:

int
lws_cache_lookup(struct lws_cache_ttl_lru *cache, const char *wildcard_key,
		 const void **pdata, size_t *psize)
{
	struct lws_cache_ttl_lru *l1 = cache;
	lws_dll2_owner_t results_owner;
	lws_usec_t expiry = 0;
	char meta_key[128];
	uint8_t *p, *temp;
	size_t sum = 0;
	int n;

	memset(&results_owner, 0, sizeof(results_owner));
	meta_key[0] = META_ITEM_LEADING;
	lws_strncpy(&meta_key[1], wildcard_key, sizeof(meta_key) - 2);

	/*
	 * If we have a cached result set in L1 already, return that
	 */

	if (!l1->info.ops->get(l1, meta_key, pdata, psize))
		return 0;

	/*
	 * No, we have to do the actual lookup work in the backing store layer
	 * to get results for this...
	 */

	while (cache->info.parent)
		cache = cache->info.parent;

	if (cache->info.ops->lookup(cache, wildcard_key, &results_owner)) {
		/* eg, OOM */

		lwsl_cache("%s: bs lookup fail\n", __func__);

		lws_cache_clear_matches(&results_owner);
		return 1;
	}

	/*
	 * Scan the results, we want to know how big a payload it needs in
	 * the cache, and we want to know the earliest expiry of any of the
	 * component parts, so the meta cache entry for these results can be
	 * expired when any of the results would expire.
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, results_owner.head) {
		lws_cache_match_t *m = lws_container_of(d, lws_cache_match_t,
							list);
		sum += 8; /* payload size, name length */
		sum += m->tag_size + 1;

		if (m->expiry && (!expiry || expiry < m->expiry))
			expiry = m->expiry;

	} lws_end_foreach_dll(d);

	lwsl_cache("%s: results %d, size %d\n", __func__,
		    (int)results_owner.count, (int)sum);

	temp = lws_malloc(sum, __func__);
	if (!temp) {
		lws_cache_clear_matches(&results_owner);
		return 1;
	}

	/*
	 * Fill temp with the serialized results
	 */

	p = temp;
	lws_start_foreach_dll(struct lws_dll2 *, d, results_owner.head) {
		lws_cache_match_t *m = lws_container_of(d, lws_cache_match_t,
							list);

		/* we don't copy the payload in, but take note of its size */
		lws_ser_wu32be(p, (uint32_t)m->payload_size);
		p += 4;
		/* length of the tag name (there is an uncounted NUL after) */
		lws_ser_wu32be(p, (uint32_t)m->tag_size);
		p += 4;

		/* then the tag name, plus the extra NUL */
		memcpy(p, &m[1], m->tag_size + 1);
		p += m->tag_size + 1;

	} lws_end_foreach_dll(d);

	lws_cache_clear_matches(&results_owner);

	/*
	 * Create the right amount of space for an L1 record of these results,
	 * with its expiry set to the earliest of the results, and copy it in
	 * from temp
	 */

	n = l1->info.ops->write(l1, meta_key, temp, sum, expiry, (void **)&p);
	/* done with temp */
	lws_free(temp);

	if (n)
		return 1;

	/* point to the results in L1 */

	*pdata = p;
	*psize = sum;

	return 0;
}